

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleMaterialNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  pointer *pppaVar1;
  iterator __position;
  aiMaterial *this_00;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  this->m_currentMaterial = this_00;
  __position._M_current =
       (this->m_materialCache).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_materialCache).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
              ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&this->m_materialCache,__position,
               &this->m_currentMaterial);
  }
  else {
    *__position._M_current = this_00;
    pppaVar1 = &(this->m_materialCache).
                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  this->m_tokenType = 0xf;
  handleNodes(this,node,pScene);
  return;
}

Assistant:

void OpenGEXImporter::handleMaterialNode( ODDLParser::DDLNode *node, aiScene *pScene ) {
    m_currentMaterial = new aiMaterial;
    m_materialCache.push_back( m_currentMaterial );
    m_tokenType = Grammar::MaterialToken;
    handleNodes( node, pScene );
}